

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_mv_component(aom_reader *r,nmv_component *mvcomp,int use_subpel,int usehp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  aom_reader *r_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int i;
  int n;
  int class0;
  int mv_class;
  int sign;
  int hp;
  int fr;
  int d;
  int mag;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  aom_reader *in_stack_ffffffffffffffa0;
  int local_3c;
  uint local_28;
  int local_24;
  uint local_20;
  int local_1c;
  
  iVar1 = aom_read_symbol_(in_stack_ffffffffffffffa0,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  iVar2 = aom_read_symbol_(in_stack_ffffffffffffffa0,
                           (aom_cdf_prob *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  if (iVar2 != 0) {
    local_20 = 0;
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      iVar3 = aom_read_symbol_(in_stack_ffffffffffffffa0,
                               (aom_cdf_prob *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      local_20 = iVar3 << ((byte)local_3c & 0x1f) | local_20;
    }
    local_1c = 2 << ((char)iVar2 + 2U & 0x1f);
  }
  else {
    local_20 = aom_read_symbol_(in_stack_ffffffffffffffa0,
                                (aom_cdf_prob *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    local_1c = 0;
  }
  if (in_EDX == 0) {
    local_24 = 3;
    local_28 = 1;
  }
  else {
    local_24 = aom_read_symbol_(in_stack_ffffffffffffffa0,
                                (aom_cdf_prob *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    if (in_ECX == 0) {
      local_28 = 1;
    }
    else {
      if (iVar2 != 0) {
        r_00 = (aom_reader *)(in_RSI + 0x42);
      }
      else {
        r_00 = (aom_reader *)(in_RSI + 0x3c);
      }
      local_28 = aom_read_symbol_(r_00,(aom_cdf_prob *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                  ,0);
    }
  }
  local_1c = (local_20 << 3 | local_24 << 1 | local_28) + 1 + local_1c;
  if (iVar1 != 0) {
    local_1c = -local_1c;
  }
  return local_1c;
}

Assistant:

static int read_mv_component(aom_reader *r, nmv_component *mvcomp,
                             int use_subpel, int usehp) {
  int mag, d, fr, hp;
  const int sign = aom_read_symbol(r, mvcomp->sign_cdf, 2, ACCT_STR);
  const int mv_class =
      aom_read_symbol(r, mvcomp->classes_cdf, MV_CLASSES, ACCT_STR);
  const int class0 = mv_class == MV_CLASS_0;

  // Integer part
  if (class0) {
    d = aom_read_symbol(r, mvcomp->class0_cdf, CLASS0_SIZE, ACCT_STR);
    mag = 0;
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    d = 0;
    for (int i = 0; i < n; ++i)
      d |= aom_read_symbol(r, mvcomp->bits_cdf[i], 2, ACCT_STR) << i;
    mag = CLASS0_SIZE << (mv_class + 2);
  }

  if (use_subpel) {
    // Fractional part
    fr = aom_read_symbol(r, class0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
                         MV_FP_SIZE, ACCT_STR);

    // High precision part (if hp is not used, the default value of the hp is 1)
    hp = usehp ? aom_read_symbol(
                     r, class0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf, 2,
                     ACCT_STR)
               : 1;
  } else {
    fr = 3;
    hp = 1;
  }

  // Result
  mag += ((d << 3) | (fr << 1) | hp) + 1;
  return sign ? -mag : mag;
}